

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

InternalParseResult * __thiscall
Catch::clara::detail::Parser::parse
          (InternalParseResult *__return_storage_ptr__,Parser *this,string *exeName,
          TokenStream *tokens)

{
  pointer pOVar1;
  pointer pAVar2;
  ParserBase *pPVar3;
  ulong uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  undefined1 auVar6 [8];
  undefined8 uVar7;
  undefined8 uVar8;
  int iVar9;
  ulong uVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Token *pTVar11;
  const_iterator __begin3;
  pointer pOVar12;
  const_iterator __begin3_1;
  pointer pAVar13;
  ulong uVar14;
  ParserInfo *__s;
  size_t *psVar15;
  bool bVar16;
  BasicResult<Catch::clara::detail::ParseState> result;
  TokenStream local_20f0;
  undefined1 local_20c8 [8];
  undefined1 local_20c0 [8];
  undefined1 local_20b8 [80];
  ParserResult local_2068;
  ParserInfo parseInfos [512];
  
  pOVar12 = (this->m_options).
            super__Vector_base<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pOVar1 = (this->m_options).
           super__Vector_base<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pAVar2 = (this->m_args).
           super__Vector_base<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pAVar13 = (this->m_args).
            super__Vector_base<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar10 = ((long)pAVar2 - (long)pAVar13) / 0x60 + ((long)pOVar1 - (long)pOVar12) / 0x78;
  if (0x1ff < uVar10) {
    __assert_fail("totalParsers < 512",
                  "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/tests/catch.hpp"
                  ,0x2585,
                  "virtual InternalParseResult Catch::clara::detail::Parser::parse(const std::string &, const TokenStream &) const"
                 );
  }
  __s = parseInfos;
  memset(__s,0,0x2000);
  for (; pOVar12 != pOVar1; pOVar12 = pOVar12 + 1) {
    __s->parser = (ParserBase *)pOVar12;
    __s = __s + 1;
  }
  for (; pAVar13 != pAVar2; pAVar13 = pAVar13 + 1) {
    __s->parser = (ParserBase *)pAVar13;
    __s = __s + 1;
  }
  ExeName::set(&local_2068,&this->m_exeName,exeName);
  BasicResult<Catch::clara::detail::ParseResultType>::~BasicResult(&local_2068);
  local_20c8._0_4_ = NoMatch;
  TokenStream::TokenStream((TokenStream *)local_20c0,tokens);
  BasicResult<Catch::clara::detail::ParseState>::ok<Catch::clara::detail::ParseState>
            (&result,(ParseState *)local_20c8);
  std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::~vector
            ((vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
             (local_20b8 + 8));
  do {
    (*result.super_ResultValueBase<Catch::clara::detail::ParseState>.super_ResultBase.
      _vptr_ResultBase[2])(&result);
    TokenStream::TokenStream
              ((TokenStream *)local_20c8,
               &result.super_ResultValueBase<Catch::clara::detail::ParseState>.field_0.m_value.
                m_remainingTokens);
    uVar8 = local_20b8._8_8_;
    uVar7 = local_20b8._0_8_;
    auVar6 = local_20c0;
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(local_20c8._4_4_,local_20c8._0_4_);
    std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::~vector
              ((vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
               local_20b8);
    if ((uVar7 == uVar8) && ((undefined1  [8])pbVar5 == auVar6)) {
      BasicResult<Catch::clara::detail::ParseState>::BasicResult(__return_storage_ptr__,&result);
      goto LAB_001a42bd;
    }
    psVar15 = &parseInfos[0].count;
    for (uVar14 = 0; uVar10 != uVar14; uVar14 = uVar14 + 1) {
      pPVar3 = ((ParserInfo *)(psVar15 + -1))->parser;
      iVar9 = (*pPVar3->_vptr_ParserBase[4])(pPVar3);
      if (CONCAT44(extraout_var,iVar9) == 0) {
LAB_001a418a:
        (*result.super_ResultValueBase<Catch::clara::detail::ParseState>.super_ResultBase.
          _vptr_ResultBase[2])(&result);
        TokenStream::TokenStream
                  (&local_20f0,
                   &result.super_ResultValueBase<Catch::clara::detail::ParseState>.field_0.m_value.
                    m_remainingTokens);
        (*pPVar3->_vptr_ParserBase[3])
                  ((BasicResult<Catch::clara::detail::ParseState> *)local_20c8,pPVar3,exeName,
                   &local_20f0);
        BasicResult<Catch::clara::detail::ParseState>::operator=
                  (&result,(BasicResult<Catch::clara::detail::ParseState> *)local_20c8);
        BasicResult<Catch::clara::detail::ParseState>::~BasicResult
                  ((BasicResult<Catch::clara::detail::ParseState> *)local_20c8);
        std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
        ~vector(&local_20f0.m_tokenBuffer);
        if (result.super_ResultValueBase<Catch::clara::detail::ParseState>.super_ResultBase.m_type
            != Ok) {
          BasicResult<Catch::clara::detail::ParseState>::BasicResult(__return_storage_ptr__,&result)
          ;
          goto LAB_001a42bd;
        }
        (*result.super_ResultValueBase<Catch::clara::detail::ParseState>.super_ResultBase.
          _vptr_ResultBase[2])(&result);
        if (result.super_ResultValueBase<Catch::clara::detail::ParseState>.field_0.m_value.m_type !=
            NoMatch) {
          bVar16 = uVar14 < uVar10;
          *psVar15 = *psVar15 + 1;
          goto LAB_001a4219;
        }
      }
      else {
        uVar4 = *psVar15;
        iVar9 = (*pPVar3->_vptr_ParserBase[4])(pPVar3);
        if (uVar4 < CONCAT44(extraout_var_00,iVar9)) goto LAB_001a418a;
      }
      psVar15 = psVar15 + 2;
    }
    bVar16 = false;
LAB_001a4219:
    (*result.super_ResultValueBase<Catch::clara::detail::ParseState>.super_ResultBase.
      _vptr_ResultBase[2])(&result);
    if (result.super_ResultValueBase<Catch::clara::detail::ParseState>.field_0.m_value.m_type ==
        ShortCircuitAll) {
      BasicResult<Catch::clara::detail::ParseState>::BasicResult(__return_storage_ptr__,&result);
      goto LAB_001a42bd;
    }
  } while (bVar16);
  (*result.super_ResultValueBase<Catch::clara::detail::ParseState>.super_ResultBase._vptr_ResultBase
    [2])();
  TokenStream::TokenStream
            ((TokenStream *)local_20c8,
             &result.super_ResultValueBase<Catch::clara::detail::ParseState>.field_0.m_value.
              m_remainingTokens);
  pTVar11 = TokenStream::operator->((TokenStream *)local_20c8);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_20f0,
                   "Unrecognised token: ",&pTVar11->token);
  BasicResult<Catch::clara::detail::ParseState>::runtimeError
            (__return_storage_ptr__,(string *)&local_20f0);
  ::std::__cxx11::string::~string((string *)&local_20f0);
  std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::~vector
            ((vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
             local_20b8);
LAB_001a42bd:
  BasicResult<Catch::clara::detail::ParseState>::~BasicResult(&result);
  return __return_storage_ptr__;
}

Assistant:

auto parse( std::string const& exeName, TokenStream const &tokens ) const -> InternalParseResult override {

            struct ParserInfo {
                ParserBase const* parser = nullptr;
                size_t count = 0;
            };
            const size_t totalParsers = m_options.size() + m_args.size();
            assert( totalParsers < 512 );
            // ParserInfo parseInfos[totalParsers]; // <-- this is what we really want to do
            ParserInfo parseInfos[512];

            {
                size_t i = 0;
                for (auto const &opt : m_options) parseInfos[i++].parser = &opt;
                for (auto const &arg : m_args) parseInfos[i++].parser = &arg;
            }

            m_exeName.set( exeName );

            auto result = InternalParseResult::ok( ParseState( ParseResultType::NoMatch, tokens ) );
            while( result.value().remainingTokens() ) {
                bool tokenParsed = false;

                for( size_t i = 0; i < totalParsers; ++i ) {
                    auto&  parseInfo = parseInfos[i];
                    if( parseInfo.parser->cardinality() == 0 || parseInfo.count < parseInfo.parser->cardinality() ) {
                        result = parseInfo.parser->parse(exeName, result.value().remainingTokens());
                        if (!result)
                            return result;
                        if (result.value().type() != ParseResultType::NoMatch) {
                            tokenParsed = true;
                            ++parseInfo.count;
                            break;
                        }
                    }
                }

                if( result.value().type() == ParseResultType::ShortCircuitAll )
                    return result;
                if( !tokenParsed )
                    return InternalParseResult::runtimeError( "Unrecognised token: " + result.value().remainingTokens()->token );
            }
            // !TBD Check missing required options
            return result;
        }